

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string alct_outFile_00;
  int iVar1;
  undefined7 uVar2;
  uint7 uVar3;
  char *__ptr;
  bool bVar4;
  double dVar5;
  size_t sStackY_460;
  undefined4 in_stack_fffffffffffffbb0;
  float confidence_level;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  string local_438;
  string local_418;
  string subfolder;
  string alct_outFile;
  string parquet_outFile;
  string local_398;
  string local_378;
  string local_358;
  string local_338 [32];
  sigaction sa;
  aalcalc a;
  
  progname = *argv;
  subfolder._M_dataplus._M_p = (pointer)&subfolder.field_2;
  subfolder._M_string_length = 0;
  parquet_outFile._M_dataplus._M_p = (pointer)&parquet_outFile.field_2;
  parquet_outFile._M_string_length = 0;
  subfolder.field_2._M_local_buf[0] = '\0';
  parquet_outFile.field_2._M_local_buf[0] = '\0';
  alct_outFile._M_dataplus._M_p = (pointer)&alct_outFile.field_2;
  alct_outFile._M_string_length = 0;
  uVar6 = 0;
  alct_outFile.field_2._M_local_buf[0] = '\0';
  confidence_level = 0.95;
  uVar8 = 0;
  uVar9 = 0;
  bVar4 = false;
  uVar7 = 0;
  do {
    while (iVar1 = getopt(argc,argv,"svdohK:p:c:l:"), iVar1 == 0x4b) {
      std::__cxx11::string::assign((char *)&subfolder);
    }
    uVar2 = (undefined7)
            ((ulong)((long)&switchD_001061be::switchdataD_00109538 +
                    (long)(int)(&switchD_001061be::switchdataD_00109538)[iVar1 - 0x6c]) >> 8);
    switch(iVar1) {
    case 0x6c:
      dVar5 = atof(_optarg);
      confidence_level = (float)dVar5;
      break;
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
switchD_001061be_caseD_6d:
      help();
LAB_001064e6:
      exit(1);
    case 0x6f:
      uVar9 = (undefined4)CONCAT71(uVar2,1);
      break;
    case 0x70:
      bVar4 = true;
      std::__cxx11::string::assign((char *)&parquet_outFile);
      break;
    case 0x73:
      uVar8 = (undefined4)CONCAT71(uVar2,1);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_001064e6;
    default:
      if (iVar1 == -1) {
        if (subfolder._M_string_length == 0) {
          __ptr = "FATAL: No folder supplied for summarycalc files\n";
          sStackY_460 = 0x30;
        }
        else if ((confidence_level < 0.0) || (1.0 < confidence_level)) {
          __ptr = "FATAL: Confidence level must lie between 0 and 1\n";
          sStackY_460 = 0x31;
        }
        else {
          if (!bVar4) {
            memset(&sa,0,0x98);
            sigemptyset((sigset_t *)&sa.sa_mask);
            sa.__sigaction_handler.sa_handler = segfault_sigaction;
            sa.sa_flags = 4;
            sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
            std::__cxx11::string::string((string *)&local_358,"",(allocator *)&a);
            std::__cxx11::string::string((string *)&local_378,"",(allocator *)&local_438);
            initstreams(&local_358,&local_378);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::string((string *)&local_398,(string *)&parquet_outFile);
            std::__cxx11::string::string(local_338,(string *)&alct_outFile);
            alct_outFile_00._M_string_length._0_4_ = in_stack_fffffffffffffbb0;
            alct_outFile_00._M_dataplus._M_p = (pointer)local_338;
            alct_outFile_00._M_string_length._4_4_ = confidence_level;
            alct_outFile_00.field_2._M_allocated_capacity._0_4_ = uVar6;
            alct_outFile_00.field_2._M_allocated_capacity._4_4_ = uVar7;
            alct_outFile_00.field_2._8_4_ = uVar8;
            alct_outFile_00.field_2._12_4_ = uVar9;
            aalcalc::aalcalc(&a,(bool)((byte)uVar8 & 1),(bool)((byte)uVar9 & 1),false,&local_398,
                             (bool)((byte)uVar7 & 1),alct_outFile_00,confidence_level);
            std::__cxx11::string::~string(local_338);
            std::__cxx11::string::~string((string *)&local_398);
            if ((uVar6 & 1) != 0) {
              aalcalc::debug(&a,&subfolder);
            }
            std::__cxx11::string::string
                      ((string *)&local_438,progname,(allocator *)&stack0xfffffffffffffbb3);
            std::__cxx11::string::string
                      ((string *)&local_418,"INFO",(allocator *)&stack0xfffffffffffffbb2);
            logprintf(&local_438,&local_418,"starting process..\n");
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            aalcalc::doit(&a,&subfolder);
            std::__cxx11::string::string
                      ((string *)&local_438,progname,(allocator *)&stack0xfffffffffffffbb3);
            std::__cxx11::string::string
                      ((string *)&local_418,"INFO",(allocator *)&stack0xfffffffffffffbb2);
            logprintf(&local_438,&local_418,"finishing process..\n");
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            aalcalc::~aalcalc(&a);
            std::__cxx11::string::~string((string *)&alct_outFile);
            std::__cxx11::string::~string((string *)&parquet_outFile);
            std::__cxx11::string::~string((string *)&subfolder);
            return 0;
          }
          __ptr = 
          "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
          ;
          sStackY_460 = 0x79;
        }
        fwrite(__ptr,sStackY_460,1,_stderr);
        goto LAB_001064e6;
      }
      uVar3 = (uint7)(uint3)((uint)iVar1 >> 8);
      if (iVar1 == 99) {
        uVar7 = (undefined4)CONCAT71(uVar3,1);
        std::__cxx11::string::assign((char *)&alct_outFile);
      }
      else {
        if (iVar1 != 100) goto switchD_001061be_caseD_6d;
        uVar6 = (uint)CONCAT71(uVar3,1);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	bool debug = false;
	bool skipheader = false;
	bool ord_output = false;   // csv output
	std::string parquet_outFile;   // parquet output
	bool parquet_output = false;   // parquet output
	std::string alct_outFile;   // Average Loss Convergence Table (ALCT)
	bool alct_output = false;   // ALCT
	float confidence_level = 0.95;
	while ((opt = getopt(argc, argv, (char *)"svdohK:p:c:l:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 's':
			skipheader = true;
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquet_outFile = optarg;
			break;
		case 'c':
			alct_output = true;
			alct_outFile = optarg;
			break;
		case 'l':
			confidence_level = atof(optarg);
			break;
		case 'd':
			debug = true;			
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	if (confidence_level < 0.0 || confidence_level > 1.0) {
		fprintf(stderr, "FATAL: Confidence level must lie between 0 and 1\n");
		exit(EXIT_FAILURE);
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet output are missing.\n"
				"Please install libraries and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	initstreams();

	
	try {
		aalcalc a(skipheader, ord_output, parquet_output,
			  parquet_outFile, alct_output, alct_outFile,
			  confidence_level);
		if (debug == true) {
			a.debug(subfolder);
		}
        	logprintf(progname, "INFO", "starting process..\n");
        	a.doit(subfolder);
        	logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}


	return EXIT_SUCCESS;

}